

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::ComplexOptionType1::~ComplexOptionType1(ComplexOptionType1 *this)

{
  ComplexOptionType1 *this_local;
  
  SharedDtor((MessageLite *)this);
  google::protobuf::Message::~Message(&this->super_Message);
  return;
}

Assistant:

ComplexOptionType1::~ComplexOptionType1() {
  // @@protoc_insertion_point(destructor:proto2_unittest.ComplexOptionType1)
  SharedDtor(*this);
}